

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::SimpleShaders::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nin vec4 position;                    \nvoid main(void)                      \n{                                    \n    gl_Position = position;          \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                      \n"
			   "in vec4 position;                    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = position;          \n"
			   "}";
	}